

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_stream.cpp
# Opt level: O3

bool __thiscall dap::ContentReader::buffer(ContentReader *this,size_t bytes)

{
  iterator *piVar1;
  _Map_pointer ppuVar2;
  element_type *peVar3;
  uchar *puVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  size_t i;
  long lVar8;
  _Elt_pointer puVar9;
  uint8_t chunk [256];
  uchar local_138 [264];
  
  ppuVar2 = (this->buf).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  puVar9 = (this->buf).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Deque_impl_data._M_start._M_last +
           (long)((this->buf).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_cur +
                 ((((((ulong)((long)ppuVar2 -
                             (long)(this->buf).
                                   super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                   _M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                   (ulong)(ppuVar2 == (_Map_pointer)0x0)) * 0x200 -
                  (long)(this->buf).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_first) -
                 (long)(this->buf).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Deque_impl_data._M_start._M_cur));
  uVar7 = bytes - (long)puVar9;
  if (puVar9 <= bytes) {
    for (; uVar7 != 0; uVar7 = uVar7 - lVar5) {
      uVar6 = 0x100;
      if (uVar7 < 0x100) {
        uVar6 = uVar7;
      }
      peVar3 = (this->reader).super___shared_ptr<dap::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      lVar5 = (**(code **)((long)*peVar3 + 0x20))(peVar3,local_138,uVar6);
      if (lVar5 == 0) {
        return false;
      }
      lVar8 = 0;
      do {
        puVar4 = (this->buf).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (puVar4 == (this->buf).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<unsigned_char,std::allocator<unsigned_char>>::
          _M_push_back_aux<unsigned_char_const&>
                    ((deque<unsigned_char,std::allocator<unsigned_char>> *)&this->buf,
                     local_138 + lVar8);
        }
        else {
          *puVar4 = local_138[lVar8];
          piVar1 = &(this->buf).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Deque_impl_data._M_finish;
          piVar1->_M_cur = piVar1->_M_cur + 1;
        }
        lVar8 = lVar8 + 1;
      } while (lVar5 != lVar8);
    }
  }
  return true;
}

Assistant:

bool ContentReader::buffer(size_t bytes) {
  if (bytes < buf.size()) {
    return true;
  }
  bytes -= buf.size();
  while (bytes > 0) {
    uint8_t chunk[256];
    auto numWant = std::min(sizeof(chunk), bytes);
    auto numGot = reader->read(chunk, numWant);
    if (numGot == 0) {
      return false;
    }
    for (size_t i = 0; i < numGot; i++) {
      buf.push_back(chunk[i]);
    }
    bytes -= numGot;
  }
  return true;
}